

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

Marray<int,_std::allocator<unsigned_long>_> * __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::operator=
          (Marray<int,std::allocator<unsigned_long>> *this,
          View<int,_true,_std::allocator<unsigned_long>_> *in)

{
  CoordinateOrder CVar1;
  void *__dest;
  void *__src;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  size_t *psVar8;
  bool *pbVar9;
  CoordinateOrder *pCVar10;
  reference piVar11;
  reference piVar12;
  ulong local_c0;
  size_t j_1;
  const_iterator it;
  ulong local_78;
  size_t j;
  undefined1 local_60 [8];
  Marray<int,_std::allocator<unsigned_long>_> m;
  View<int,_true,_std::allocator<unsigned_long>_> *in_local;
  Marray<int,_std::allocator<unsigned_long>_> *this_local;
  
  m._64_8_ = in;
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(in);
  if (this != (Marray<int,std::allocator<unsigned_long>> *)m._64_8_) {
    if (*(long *)m._64_8_ == 0) {
      piVar7 = *(int **)this;
      sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::size
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
      __gnu_cxx::new_allocator<int>::deallocate((new_allocator<int> *)(this + 0x40),piVar7,sVar5);
      *(undefined8 *)this = 0;
      marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
                ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),
                 (Geometry<std::allocator<unsigned_long>_> *)(m._64_8_ + 8));
    }
    else {
      bVar4 = View<int,false,std::allocator<unsigned_long>>::
              overlaps<int,true,std::allocator<unsigned_long>>
                        ((View<int,false,std::allocator<unsigned_long>> *)this,
                         (View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
      if (bVar4) {
        Marray<int,true,std::allocator<unsigned_long>>
                  ((Marray<int,std::allocator<unsigned_long>> *)local_60,
                   (View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
        Marray<int,_std::allocator<unsigned_long>_>::operator=
                  ((Marray<int,_std::allocator<unsigned_long>_> *)this,
                   (Marray<int,_std::allocator<unsigned_long>_> *)local_60);
        Marray<int,_std::allocator<unsigned_long>_>::~Marray
                  ((Marray<int,_std::allocator<unsigned_long>_> *)local_60);
      }
      else {
        sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::size
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
        sVar6 = View<int,_true,_std::allocator<unsigned_long>_>::size
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
        if (sVar5 != sVar6) {
          piVar7 = *(int **)this;
          sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::size
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
          __gnu_cxx::new_allocator<int>::deallocate
                    ((new_allocator<int> *)(this + 0x40),piVar7,sVar5);
          sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::size
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
          piVar7 = __gnu_cxx::new_allocator<int>::allocate
                             ((new_allocator<int> *)(this + 0x40),sVar5,(void *)0x0);
          *(int **)this = piVar7;
        }
        sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
        marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
                  ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),sVar5);
        for (local_78 = 0;
            sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_),
            local_78 < sVar5; local_78 = local_78 + 1) {
          sVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                            ((Geometry<std::allocator<unsigned_long>_> *)(m._64_8_ + 8),local_78);
          psVar8 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                             ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),local_78);
          *psVar8 = sVar5;
          sVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                            ((Geometry<std::allocator<unsigned_long>_> *)(m._64_8_ + 8),local_78);
          psVar8 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                             ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),local_78);
          *psVar8 = sVar5;
          sVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                            ((Geometry<std::allocator<unsigned_long>_> *)(m._64_8_ + 8),local_78);
          psVar8 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides
                             ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),local_78);
          *psVar8 = sVar5;
        }
        sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::size
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
        psVar8 = marray_detail::Geometry<std::allocator<unsigned_long>_>::size
                           ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
        *psVar8 = sVar5;
        pbVar9 = marray_detail::Geometry<std::allocator<unsigned_long>_>::isSimple
                           ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
        *pbVar9 = true;
        pCVar10 = View<int,_true,_std::allocator<unsigned_long>_>::coordinateOrder
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
        CVar1 = *pCVar10;
        pCVar10 = marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder
                            ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
        *pCVar10 = CVar1;
        bVar4 = View<int,_true,_std::allocator<unsigned_long>_>::isSimple
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
        if (bVar4) {
          __dest = *(void **)this;
          __src = *(void **)m._64_8_;
          sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::size
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
          memcpy(__dest,__src,sVar5 << 2);
        }
        else {
          sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
          uVar3 = m._64_8_;
          if (sVar5 == 1) {
            uVar2 = *(undefined8 *)this;
            piVar11 = View<int,true,std::allocator<unsigned_long>>::operator()
                                ((View<int,true,std::allocator<unsigned_long>> *)m._64_8_,0);
            marray_detail::
            OperateHelperBinary<(unsigned_short)1,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(this,uVar3,uVar2,piVar11);
          }
          else {
            sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
            uVar3 = m._64_8_;
            if (sVar5 == 2) {
              uVar2 = *(undefined8 *)this;
              piVar11 = View<int,true,std::allocator<unsigned_long>>::operator()
                                  ((View<int,true,std::allocator<unsigned_long>> *)m._64_8_,0);
              marray_detail::
              OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(this,uVar3,uVar2,piVar11);
            }
            else {
              sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                                ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
              uVar3 = m._64_8_;
              if (sVar5 == 3) {
                uVar2 = *(undefined8 *)this;
                piVar11 = View<int,true,std::allocator<unsigned_long>>::operator()
                                    ((View<int,true,std::allocator<unsigned_long>> *)m._64_8_,0);
                marray_detail::
                OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(this,uVar3,uVar2,piVar11);
              }
              else {
                sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
                uVar3 = m._64_8_;
                if (sVar5 == 4) {
                  uVar2 = *(undefined8 *)this;
                  piVar11 = View<int,true,std::allocator<unsigned_long>>::operator()
                                      ((View<int,true,std::allocator<unsigned_long>> *)m._64_8_,0);
                  marray_detail::
                  OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::operate(this,uVar3,uVar2,piVar11);
                }
                else {
                  sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
                  uVar3 = m._64_8_;
                  if (sVar5 == 5) {
                    uVar2 = *(undefined8 *)this;
                    piVar11 = View<int,true,std::allocator<unsigned_long>>::operator()
                                        ((View<int,true,std::allocator<unsigned_long>> *)m._64_8_,0)
                    ;
                    marray_detail::
                    OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::operate(this,uVar3,uVar2,piVar11);
                  }
                  else {
                    sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                                      ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_);
                    uVar3 = m._64_8_;
                    if (sVar5 == 6) {
                      uVar2 = *(undefined8 *)this;
                      piVar11 = View<int,true,std::allocator<unsigned_long>>::operator()
                                          ((View<int,true,std::allocator<unsigned_long>> *)m._64_8_,
                                           0);
                      marray_detail::
                      OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                      ::operate(this,uVar3,uVar2,piVar11);
                    }
                    else {
                      sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                                        ((View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_
                                        );
                      uVar3 = m._64_8_;
                      if (sVar5 == 7) {
                        uVar2 = *(undefined8 *)this;
                        piVar11 = View<int,true,std::allocator<unsigned_long>>::operator()
                                            ((View<int,true,std::allocator<unsigned_long>> *)
                                             m._64_8_,0);
                        marray_detail::
                        OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::operate(this,uVar3,uVar2,piVar11);
                      }
                      else {
                        sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                                          ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                           m._64_8_);
                        uVar3 = m._64_8_;
                        if (sVar5 == 8) {
                          uVar2 = *(undefined8 *)this;
                          piVar11 = View<int,true,std::allocator<unsigned_long>>::operator()
                                              ((View<int,true,std::allocator<unsigned_long>> *)
                                               m._64_8_,0);
                          marray_detail::
                          OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                          ::operate(this,uVar3,uVar2,piVar11);
                        }
                        else {
                          sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                                            ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                             m._64_8_);
                          uVar3 = m._64_8_;
                          if (sVar5 == 9) {
                            uVar2 = *(undefined8 *)this;
                            piVar11 = View<int,true,std::allocator<unsigned_long>>::operator()
                                                ((View<int,true,std::allocator<unsigned_long>> *)
                                                 m._64_8_,0);
                            marray_detail::
                            OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                            ::operate(this,uVar3,uVar2,piVar11);
                          }
                          else {
                            sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                                              ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                               m._64_8_);
                            uVar3 = m._64_8_;
                            if (sVar5 == 10) {
                              uVar2 = *(undefined8 *)this;
                              piVar11 = View<int,true,std::allocator<unsigned_long>>::operator()
                                                  ((View<int,true,std::allocator<unsigned_long>> *)
                                                   m._64_8_,0);
                              marray_detail::
                              OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                              ::operate(this,uVar3,uVar2,piVar11);
                            }
                            else {
                              View<int,_true,_std::allocator<unsigned_long>_>::begin
                                        ((const_iterator *)&j_1,
                                         (View<int,_true,_std::allocator<unsigned_long>_> *)m._64_8_
                                        );
                              local_c0 = 0;
                              while (sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::size
                                                       ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )this), local_c0 < sVar5) {
                                piVar12 = Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                          operator*((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&j_1);
                                *(int *)(*(long *)this + local_c0 * 4) = *piVar12;
                                local_c0 = local_c0 + 1;
                                Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                                          ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                           &j_1);
                              }
                              Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
                                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_1
                                        );
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Marray<int,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<int,_std::allocator<unsigned_long>_> *)this);
  return (Marray<int,_std::allocator<unsigned_long>_> *)this;
}

Assistant:

Marray<T, A>&
Marray<T, A>::operator=
(
    const View<TLocal, isConstLocal, ALocal>& in
)
{
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }
    if( (void*)(this) != (void*)(&in) ) { // no self-assignment
        if(in.data_ == 0) {
            dataAllocator_.deallocate(this->data_, this->size());
            this->data_ = 0;
            this->geometry_ = in.geometry_;
        }
        else if(this->overlaps(in)) {
            Marray<T, A> m = in; // temporary copy
            (*this) = m;
        }
        else {
            // re-alloc memory if necessary
            if(this->size() != in.size()) {
                dataAllocator_.deallocate(this->data_, this->size());
                this->data_ = dataAllocator_.allocate(in.size());
            }

            // copy geometry
            this->geometry_.resize(in.dimension());
            for(std::size_t j=0; j<in.dimension(); ++j) {
                this->geometry_.shape(j) = in.geometry_.shape(j);
                this->geometry_.shapeStrides(j) = in.geometry_.shapeStrides(j);
                this->geometry_.strides(j) = in.geometry_.shapeStrides(j); // !
            }
            this->geometry_.size() = in.size();
            this->geometry_.isSimple() = true;
            this->geometry_.coordinateOrder() = in.coordinateOrder();

            // copy data
            if(in.isSimple() && marray_detail::IsEqual<T, TLocal>::type) {
                memcpy(this->data_, in.data_, (in.size())*sizeof(T));
            }
            else if(in.dimension() == 1)
                marray_detail::OperateHelperBinary<1, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 2)
                marray_detail::OperateHelperBinary<2, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 3)
                marray_detail::OperateHelperBinary<3, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 4)
                marray_detail::OperateHelperBinary<4, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 5)
                marray_detail::OperateHelperBinary<5, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 6)
                marray_detail::OperateHelperBinary<6, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 7)
                marray_detail::OperateHelperBinary<7, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 8)
                marray_detail::OperateHelperBinary<8, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 9)
                marray_detail::OperateHelperBinary<9, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 10)
                marray_detail::OperateHelperBinary<10, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else {
                typename View<TLocal, isConstLocal, ALocal>::const_iterator it = in.begin();
                for(std::size_t j=0; j<this->size(); ++j, ++it) {
                    this->data_[j] = static_cast<T>(*it);
                }
            }
        }
    }
    testInvariant();
    return *this;
}